

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O2

void absl::lts_20250127::base_internal::
     CallOnceImpl<void(&)(std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*),std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*>
               (Nonnull<std::atomic<uint32_t>_*> control,SchedulingMode scheduling_mode,
               _func_void_pair<const_google::protobuf::FileDescriptorTables_ptr,_const_google::protobuf::SourceCodeInfo_ptr>_ptr
               *fn,pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
                   **args)

{
  __int_type_conflict1 _Var1;
  uint32_t uVar2;
  bool bVar3;
  
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  if ((((_Var1 != 0) && (_Var1 != 0xdd)) && (_Var1 != 0x5a308d2)) && (_Var1 != 0x65c2937b)) {
    raw_log_internal::RawLog(kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/call_once.h"
                  ,0xa4,
                  "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = void (&)(std::pair<const google::protobuf::FileDescriptorTables *, const google::protobuf::SourceCodeInfo *> *), Args = <std::pair<const google::protobuf::FileDescriptorTables *, const google::protobuf::SourceCodeInfo *> *>]"
                 );
  }
  LOCK();
  bVar3 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
  if (bVar3) {
    (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
  }
  UNLOCK();
  if ((bVar3) ||
     (uVar2 = SpinLockWait(control,3,
                           CallOnceImpl<void_(&)(std::pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>_*),_std::pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>_*>
                           ::trans,scheduling_mode), uVar2 == 0)) {
    (*fn)(*args);
    LOCK();
    _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
    (control->super___atomic_base<unsigned_int>)._M_i = 0xdd;
    UNLOCK();
    if (_Var1 == 0x5a308d2) {
      AbslInternalSpinLockWake_lts_20250127(control,true);
      return;
    }
  }
  return;
}

Assistant:

void
    CallOnceImpl(absl::Nonnull<std::atomic<uint32_t>*> control,
                 base_internal::SchedulingMode scheduling_mode, Callable&& fn,
                 Args&&... args) {
#ifndef NDEBUG
  {
    uint32_t old_control = control->load(std::memory_order_relaxed);
    if (old_control != kOnceInit &&
        old_control != kOnceRunning &&
        old_control != kOnceWaiter &&
        old_control != kOnceDone) {
      ABSL_RAW_LOG(FATAL, "Unexpected value for control word: 0x%lx",
                   static_cast<unsigned long>(old_control));  // NOLINT
    }
  }
#endif  // NDEBUG
  static const base_internal::SpinLockWaitTransition trans[] = {
      {kOnceInit, kOnceRunning, true},
      {kOnceRunning, kOnceWaiter, false},
      {kOnceDone, kOnceDone, true}};

  // Must do this before potentially modifying control word's state.
  base_internal::SchedulingHelper maybe_disable_scheduling(scheduling_mode);
  // Short circuit the simplest case to avoid procedure call overhead.
  // The base_internal::SpinLockWait() call returns either kOnceInit or
  // kOnceDone. If it returns kOnceDone, it must have loaded the control word
  // with std::memory_order_acquire and seen a value of kOnceDone.
  uint32_t old_control = kOnceInit;
  if (control->compare_exchange_strong(old_control, kOnceRunning,
                                       std::memory_order_relaxed) ||
      base_internal::SpinLockWait(control, ABSL_ARRAYSIZE(trans), trans,
                                  scheduling_mode) == kOnceInit) {
    base_internal::invoke(std::forward<Callable>(fn),
                          std::forward<Args>(args)...);
    old_control =
        control->exchange(base_internal::kOnceDone, std::memory_order_release);
    if (old_control == base_internal::kOnceWaiter) {
      base_internal::SpinLockWake(control, true);
    }
  }  // else *control is already kOnceDone
}